

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address-conversion.cc
# Opt level: O2

string * num2mac_abi_cxx11_(string *__return_storage_ptr__,uint64_t i)

{
  ostream *poVar1;
  long lVar2;
  bool bVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nums;
  stringstream ss;
  long local_1a8 [3];
  uint auStack_190 [88];
  
  nums.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nums.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nums.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar2 = 5;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, _ss = (uint)i, bVar3) {
    _ss = _ss & 0xff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&nums,(uint *)&ss);
    i = i >> 8;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&nums,(uint *)&ss);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
  lVar2 = 5;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    poVar1 = std::operator<<((ostream *)local_1a8,0x30);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)local_1a8,":");
  }
  poVar1 = std::operator<<((ostream *)local_1a8,0x30);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&nums.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string num2mac(uint64_t i)
{
    std::vector<uint32_t> nums;
    for (size_t j = 0; j < 5; ++j)
    {
        nums.push_back(i % 0x100);
        i = (i - i % 0x100) / 0x100;
    }
    nums.push_back(i);

    std::stringstream ss;
    ss << std::hex;
    for (size_t i = 5; i > 0; --i)
    {
        ss << std::setfill('0') << std::setw(2) << nums[i];
        ss << ":";
    }
    ss << std::setfill('0') << std::setw(2) << nums[0];
    return ss.str();
}